

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestArgsBase::~TestArgsBase(TestArgsBase *this)

{
  code *pcVar1;
  TestArgsBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~TestArgsBase() { }